

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_set_operation.cpp
# Opt level: O3

JoinCondition *
duckdb::CreateNotDistinctComparison(JoinCondition *__return_storage_ptr__,LogicalType *type,idx_t i)

{
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> this;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  JoinCondition *extraout_RAX;
  LogicalType LStack_38;
  
  (__return_storage_ptr__->left).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  (__return_storage_ptr__->right).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  this.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x60);
  LogicalType::LogicalType(&LStack_38,type);
  BoundReferenceExpression::BoundReferenceExpression
            ((BoundReferenceExpression *)
             this.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,&LStack_38,i);
  LogicalType::~LogicalType(&LStack_38);
  (__return_storage_ptr__->left).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       this.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  this_00._M_head_impl = (Expression *)operator_new(0x60);
  LogicalType::LogicalType(&LStack_38,type);
  BoundReferenceExpression::BoundReferenceExpression
            ((BoundReferenceExpression *)this_00._M_head_impl,&LStack_38,i);
  LogicalType::~LogicalType(&LStack_38);
  (__return_storage_ptr__->right).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_00._M_head_impl;
  __return_storage_ptr__->comparison = COMPARE_BOUNDARY_END;
  return extraout_RAX;
}

Assistant:

static JoinCondition CreateNotDistinctComparison(const LogicalType &type, idx_t i) {
	JoinCondition cond;
	cond.left = make_uniq<BoundReferenceExpression>(type, i);
	cond.right = make_uniq<BoundReferenceExpression>(type, i);
	cond.comparison = ExpressionType::COMPARE_NOT_DISTINCT_FROM;
	return cond;
}